

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaBaseRunner.cpp
# Opt level: O1

int __thiscall xmrig::CudaBaseRunner::init(CudaBaseRunner *this,EVP_PKEY_CTX *ctx)

{
  CudaLaunchData *pCVar1;
  bool result;
  int iVar2;
  nvid_ctx *ctx_00;
  undefined7 extraout_var;
  
  pCVar1 = this->m_data;
  ctx_00 = CudaLib::alloc((pCVar1->thread).m_index,(pCVar1->thread).m_bfactor,
                          (pCVar1->thread).m_bsleep);
  this->m_ctx = ctx_00;
  iVar2 = CudaLib::deviceInfo(ctx_00,(this->m_data->thread).m_blocks,
                              (this->m_data->thread).m_threads);
  if (iVar2 == 0) {
    result = CudaLib::deviceInit(this->m_ctx);
    iVar2 = (int)CONCAT71(extraout_var,result);
    callWrapper(this,result);
  }
  else {
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

bool xmrig::CudaBaseRunner::init()
{
    m_ctx = CudaLib::alloc(m_data.thread.index(), m_data.thread.bfactor(), m_data.thread.bsleep());
    if (CudaLib::deviceInfo(m_ctx, m_data.thread.blocks(), m_data.thread.threads())) {
        return false;
    }

    return callWrapper(CudaLib::deviceInit(m_ctx));
}